

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

archive * archive_read_new(void)

{
  archive_entry *paVar1;
  archive_read *a;
  
  a = (archive_read *)calloc(1,0x858);
  if (a == (archive_read *)0x0) {
    a = (archive_read *)0x0;
  }
  else {
    (a->archive).magic = 0xdeb0c5;
    (a->archive).state = 1;
    paVar1 = archive_entry_new2((archive *)a);
    a->entry = paVar1;
    (a->archive).vtable = &archive_read_vtable;
    (a->passphrases).last = &(a->passphrases).first;
  }
  return &a->archive;
}

Assistant:

struct archive *
archive_read_new(void)
{
	struct archive_read *a;

	a = calloc(1, sizeof(*a));
	if (a == NULL)
		return (NULL);
	a->archive.magic = ARCHIVE_READ_MAGIC;

	a->archive.state = ARCHIVE_STATE_NEW;
	a->entry = archive_entry_new2(&a->archive);
	a->archive.vtable = &archive_read_vtable;

	a->passphrases.last = &a->passphrases.first;

	return (&a->archive);
}